

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O3

void __thiscall QTeamCityLogger::stopLogging(QTeamCityLogger *this)

{
  long in_FS_OFFSET;
  QTestCharBuffer buf;
  QTestCharBuffer local_230;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_230,0xaa,0x210);
  local_230._size = 0x200;
  local_230.staticBuf[0] = '\0';
  local_230.buf = local_230.staticBuf;
  QTest::qt_asprintf(&local_230,"##teamcity[testSuiteFinished name=\'%s\' flowId=\'%s\']\n",
                     (this->flowID).buf);
  QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,local_230.buf);
  QAbstractTestLogger::stopLogging(&this->super_QAbstractTestLogger);
  if (local_230.buf != local_230.staticBuf) {
    free(local_230.buf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTeamCityLogger::stopLogging()
{
    QTestCharBuffer buf;
    QTest::qt_asprintf(&buf, "##teamcity[testSuiteFinished name='%s' flowId='%s']\n",
                       flowID.constData(), flowID.constData());
    outputString(buf.constData());

    QAbstractTestLogger::stopLogging();
}